

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

number_validator<short> __thiscall goodform::sub_form::int16(sub_form *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 *in_RSI;
  number_validator<short> nVar3;
  int16_t val;
  short local_5c;
  allocator<char> local_59;
  string local_58;
  error_message local_38;
  
  bVar1 = convert<short>((any *)in_RSI[1],&local_5c);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"NOT A int16_t",&local_59);
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    uVar2 = extraout_RDX_00;
  }
  this->error_ = (error_message *)*in_RSI;
  *(short *)&this->variant_ = local_5c;
  nVar3._8_8_ = uVar2;
  nVar3.error_ = (error_message *)this;
  return nVar3;
}

Assistant:

number_validator<std::int16_t> sub_form::int16()
  {
    std::int16_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A int16_t");
    return number_validator<std::int16_t>(val, this->error_);
  }